

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ugui.c
# Opt level: O0

ugui_t * ugui_create(uint32_t w,uint32_t h)

{
  ugui_t *puVar1;
  ugui_buffer_t *puVar2;
  ugui_graphics_t *puVar3;
  int local_1c;
  int i;
  ugui_t *gui;
  uint32_t h_local;
  uint32_t w_local;
  
  puVar1 = (ugui_t *)malloc(0xa0);
  puVar2 = _ugui_buffer_create((uint16_t)w,(uint16_t)h,0,0);
  puVar1->buffer = puVar2;
  puVar1->w = w;
  puVar1->h = h;
  puVar1->window_index = 0;
  for (local_1c = 0; local_1c < 0x10; local_1c = local_1c + 1) {
    puVar1->windows[local_1c] = (ugui_window_t *)0x0;
  }
  puVar3 = ugui_graphics_create(w,h,puVar1->buffer);
  puVar1->graphics = puVar3;
  return puVar1;
}

Assistant:

ugui_t* ugui_create(uint32_t w, uint32_t h)
{
	ugui_t* gui = malloc(sizeof(struct ugui_s));

	gui->buffer = _ugui_buffer_create(w, h, 0, 0);

	gui->w = w;
	gui->h = h;
	gui->window_index = 0;

	for (int i = 0; i < UGUI_MAX_WINDOW_DEPTH; i++) {
		gui->windows[i] = NULL;
	}

	gui->graphics = ugui_graphics_create(w, h, gui->buffer);

	return gui;
}